

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O3

void __thiscall
xray_re::xr_ogf_v4::partition_io::import(partition_io *this,xr_reader *r,xr_bone_vec *all_bones)

{
  uint uVar1;
  ushort *puVar2;
  uint *puVar3;
  size_t __n;
  int iVar4;
  xr_bone *pxVar5;
  pointer ppxVar6;
  ulong uVar7;
  ulong uVar8;
  string name;
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  xr_reader::r_sz(r,&(this->super_xr_partition).m_name);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  puVar2 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  uVar8 = (ulong)*puVar2;
  if (uVar8 != 0) {
    local_38 = &(this->super_xr_partition).m_bones;
    do {
      xr_reader::r_sz(r,&local_58);
      puVar3 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
      uVar1 = *puVar3;
      uVar7 = (ulong)uVar1;
      if (0x3f < uVar7) {
        __assert_fail("id < MAX_BONES",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                      ,0x178,
                      "void xray_re::xr_ogf_v4::partition_io::import(xr_reader &, xr_bone_vec &)");
      }
      ppxVar6 = (all_bones->
                super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>)._M_impl
                .super__Vector_impl_data._M_start;
      if ((ulong)((long)(all_bones->
                        super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>)
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppxVar6 >> 3) <= uVar7) {
        std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::resize
                  (all_bones,uVar7 + 1);
        ppxVar6 = (all_bones->
                  super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      }
      pxVar5 = ppxVar6[uVar7];
      if (pxVar5 == (xr_bone *)0x0) {
        pxVar5 = (xr_bone *)operator_new(0x340);
        xr_bone::xr_bone(pxVar5);
        pxVar5->_vptr_xr_bone = (_func_int **)&PTR__xr_bone_0024a710;
        pxVar5->m_id = (uint16_t)uVar1;
        std::__cxx11::string::_M_assign((string *)&pxVar5->m_name);
        (all_bones->super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>).
        _M_impl.super__Vector_impl_data._M_start[uVar7] = pxVar5;
      }
      else {
        if ((ulong)((long)(all_bones->
                          super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)ppxVar6 >> 3) <= uVar7
           ) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar7);
        }
        __n = (pxVar5->m_name)._M_string_length;
        if ((__n != local_58._M_string_length) ||
           ((__n != 0 &&
            (iVar4 = bcmp((pxVar5->m_name)._M_dataplus._M_p,local_58._M_dataplus._M_p,__n),
            iVar4 != 0)))) {
          __assert_fail("all_bones.at(id)->name() == name",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                        ,0x180,
                        "void xray_re::xr_ogf_v4::partition_io::import(xr_reader &, xr_bone_vec &)")
          ;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_38,&local_58);
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

inline void xr_ogf_v4::partition_io::import(xr_reader& r, xr_bone_vec& all_bones)
{
	r.r_sz(m_name);
	std::string name;
	for (uint_fast32_t n = r.r_u16(); n; --n) {
		r.r_sz(name);
		uint_fast32_t id = r.r_u32();
		xr_assert(id < MAX_BONES);
		if (all_bones.size() <= id)
			all_bones.resize(id + 1);
		if (all_bones[id] == 0) {
			xr_ogf_v4::bone_io* bone = new xr_ogf_v4::bone_io;
			bone->define(uint16_t(id), name);
			all_bones[id] = bone;
		} else {
			xr_assert(all_bones.at(id)->name() == name);
		}
		m_bones.push_back(name);
	}
}